

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

BufferPackingStandard packing_to_substruct_packing(BufferPackingStandard packing)

{
  BufferPackingStandard local_c;
  BufferPackingStandard packing_local;
  
  switch(packing) {
  case BufferPackingStd140EnhancedLayout:
    local_c = BufferPackingStd140;
    break;
  case BufferPackingStd430EnhancedLayout:
    local_c = BufferPackingStd430;
    break;
  default:
    local_c = packing;
    break;
  case BufferPackingHLSLCbufferPackOffset:
    local_c = BufferPackingHLSLCbuffer;
    break;
  case BufferPackingScalarEnhancedLayout:
    local_c = BufferPackingScalar;
  }
  return local_c;
}

Assistant:

static BufferPackingStandard packing_to_substruct_packing(BufferPackingStandard packing)
{
	switch (packing)
	{
	case BufferPackingStd140EnhancedLayout:
		return BufferPackingStd140;
	case BufferPackingStd430EnhancedLayout:
		return BufferPackingStd430;
	case BufferPackingHLSLCbufferPackOffset:
		return BufferPackingHLSLCbuffer;
	case BufferPackingScalarEnhancedLayout:
		return BufferPackingScalar;
	default:
		return packing;
	}
}